

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeStamp.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::TimeStamp::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,TimeStamp *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Time Stamp:       ",0x12);
  ENUMS::GetEnumAsStringTimeStampType_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((this->m_TimeStampUnion).m_ui32TimeStamp & 1),Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString TimeStamp::GetAsString() const
{
    KStringStream ss;

    ss << "Time Stamp:       ";
    ss << GetEnumAsStringTimeStampType( m_TimeStampUnion.m_ui32TimeStampType ) << ": "
       << m_TimeStampUnion.m_ui32Time
       << "\n";

    return ss.str();
}